

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

Instruction * __thiscall spvtools::opt::IRContext::KillInst(IRContext *this,Instruction *inst)

{
  pointer pIVar1;
  TypeManager *this_00;
  ConstantManager *this_01;
  Instruction *pIVar2;
  bool bVar3;
  Analysis AVar4;
  uint32_t uVar5;
  DefUseManager *this_02;
  DebugInfoManager *pDVar6;
  Instruction *pIVar7;
  Instruction *l_inst;
  pointer inst_00;
  Instruction *local_28;
  
  if (inst != (Instruction *)0x0) {
    local_28 = inst;
    KillNamesAndDecorates(this,inst);
    KillOperandFromDebugInstructions(this,inst);
    AVar4 = this->valid_analyses_;
    if ((AVar4 & kAnalysisBegin) != kAnalysisNone) {
      this_02 = get_def_use_mgr(this);
      analysis::DefUseManager::ClearInst(this_02,inst);
      pIVar1 = (inst->dbg_line_insts_).
               super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (inst_00 = (inst->dbg_line_insts_).
                     super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                     ._M_impl.super__Vector_impl_data._M_start; inst_00 != pIVar1;
          inst_00 = inst_00 + 1) {
        analysis::DefUseManager::ClearInst(this_02,inst_00);
      }
      AVar4 = this->valid_analyses_;
    }
    if ((AVar4 & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
      std::
      _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->instr_to_block_)._M_h,&local_28);
      AVar4 = this->valid_analyses_;
    }
    if (((AVar4 & kAnalysisDecorations) != kAnalysisNone) &&
       (bVar3 = Instruction::IsDecoration(local_28), bVar3)) {
      analysis::DecorationManager::RemoveDecoration
                ((this->decoration_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
                 _M_head_impl,local_28);
    }
    if ((this->valid_analyses_ & kAnalysisDebugInfo) != kAnalysisNone) {
      pDVar6 = get_debug_info_mgr(this);
      analysis::DebugInfoManager::ClearDebugScopeAndInlinedAtUses(pDVar6,local_28);
      pDVar6 = get_debug_info_mgr(this);
      analysis::DebugInfoManager::ClearDebugInfo(pDVar6,local_28);
    }
    if (((this->type_mgr_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
         .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl !=
         (TypeManager *)0x0) && (bVar3 = IsTypeInst(local_28->opcode_), bVar3)) {
      this_00 = (this->type_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
      uVar5 = Instruction::result_id(local_28);
      analysis::TypeManager::RemoveId(this_00,uVar5);
    }
    if (((this->constant_mgr_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
         .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl !=
         (ConstantManager *)0x0) && (bVar3 = IsConstantInst(local_28->opcode_), bVar3)) {
      this_01 = (this->constant_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
                _M_head_impl;
      uVar5 = Instruction::result_id(local_28);
      analysis::ConstantManager::RemoveId(this_01,uVar5);
    }
    if ((local_28->opcode_ == OpCapability) || (local_28->opcode_ == OpExtension)) {
      ResetFeatureManager(this);
    }
    RemoveFromIdToName(this,local_28);
    pIVar2 = (local_28->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    if (pIVar2 != (Instruction *)0x0) {
      pIVar7 = (Instruction *)0x0;
      if ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
        pIVar7 = pIVar2;
      }
      utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList
                (&local_28->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
      if (local_28 == (Instruction *)0x0) {
        return pIVar7;
      }
      (*(local_28->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])
                ();
      return pIVar7;
    }
    Instruction::ToNop(local_28);
  }
  return (Instruction *)0x0;
}

Assistant:

Instruction* IRContext::KillInst(Instruction* inst) {
  if (!inst) {
    return nullptr;
  }

  KillNamesAndDecorates(inst);

  KillOperandFromDebugInstructions(inst);

  if (AreAnalysesValid(kAnalysisDefUse)) {
    analysis::DefUseManager* def_use_mgr = get_def_use_mgr();
    def_use_mgr->ClearInst(inst);
    for (auto& l_inst : inst->dbg_line_insts()) def_use_mgr->ClearInst(&l_inst);
  }
  if (AreAnalysesValid(kAnalysisInstrToBlockMapping)) {
    instr_to_block_.erase(inst);
  }
  if (AreAnalysesValid(kAnalysisDecorations)) {
    if (inst->IsDecoration()) {
      decoration_mgr_->RemoveDecoration(inst);
    }
  }
  if (AreAnalysesValid(kAnalysisDebugInfo)) {
    get_debug_info_mgr()->ClearDebugScopeAndInlinedAtUses(inst);
    get_debug_info_mgr()->ClearDebugInfo(inst);
  }
  if (type_mgr_ && IsTypeInst(inst->opcode())) {
    type_mgr_->RemoveId(inst->result_id());
  }
  if (constant_mgr_ && IsConstantInst(inst->opcode())) {
    constant_mgr_->RemoveId(inst->result_id());
  }
  if (inst->opcode() == spv::Op::OpCapability ||
      inst->opcode() == spv::Op::OpExtension) {
    // We reset the feature manager, instead of updating it, because it is just
    // as much work.  We would have to remove all capabilities implied by this
    // capability that are not also implied by the remaining OpCapability
    // instructions. We could update extensions, but we will see if it is
    // needed.
    ResetFeatureManager();
  }

  RemoveFromIdToName(inst);

  Instruction* next_instruction = nullptr;
  if (inst->IsInAList()) {
    next_instruction = inst->NextNode();
    inst->RemoveFromList();
    delete inst;
  } else {
    // Needed for instructions that are not part of a list like OpLabels,
    // OpFunction, OpFunctionEnd, etc..
    inst->ToNop();
  }
  return next_instruction;
}